

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_set_all_gej_var(secp256k1_ge *r,secp256k1_gej *a,size_t len)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int *unaff_RBP;
  secp256k1_gej *a_00;
  secp256k1_gej *__src;
  secp256k1_gej *b;
  secp256k1_gej *__src_00;
  secp256k1_gej *psVar11;
  secp256k1_fe *psVar12;
  secp256k1_fe *psVar13;
  secp256k1_fe *psVar14;
  secp256k1_ge *psVar15;
  int *piVar16;
  bool bVar17;
  secp256k1_fe u;
  secp256k1_fe sStack_2d0;
  secp256k1_fe *psStack_2a0;
  secp256k1_fe sStack_290;
  secp256k1_fe sStack_260;
  secp256k1_fe sStack_230;
  secp256k1_fe sStack_1f8;
  secp256k1_fe sStack_1c8;
  secp256k1_fe sStack_198;
  secp256k1_gej *psStack_160;
  secp256k1_gej *psStack_158;
  secp256k1_fe *psStack_150;
  undefined1 *puStack_148;
  secp256k1_fe *psStack_140;
  secp256k1_fe *psStack_138;
  secp256k1_gej sStack_130;
  size_t sStack_98;
  secp256k1_ge *psStack_90;
  int *piStack_88;
  secp256k1_gej *psStack_80;
  secp256k1_ge *psStack_78;
  int *piStack_70;
  int *local_68;
  uint64_t local_60;
  uint64_t uStack_58;
  uint64_t local_50;
  uint64_t uStack_48;
  uint64_t local_40;
  undefined8 uStack_38;
  
  if (len == 0) {
    local_68 = (int *)0xffffffffffffffff;
  }
  else {
    psVar12 = &a->z;
    local_68 = (int *)0xffffffffffffffff;
    unaff_RBP = (int *)0x0;
    psVar15 = r;
    do {
      piStack_70 = (int *)0x158b64;
      secp256k1_gej_verify((secp256k1_gej *)(psVar12 + -2));
      if ((int)psVar12[1].n[0] == 0) {
        if (local_68 == (int *)0xffffffffffffffff) {
          uVar4 = psVar12->n[0];
          uVar5 = psVar12->n[1];
          uVar6 = psVar12->n[2];
          uVar7 = psVar12->n[3];
          iVar9 = psVar12->magnitude;
          iVar8 = psVar12->normalized;
          (psVar15->x).n[4] = psVar12->n[4];
          (psVar15->x).magnitude = iVar9;
          (psVar15->x).normalized = iVar8;
          (psVar15->x).n[2] = uVar6;
          (psVar15->x).n[3] = uVar7;
          (psVar15->x).n[0] = uVar4;
          (psVar15->x).n[1] = uVar5;
          local_68 = unaff_RBP;
        }
        else {
          piStack_70 = (int *)0x158b92;
          secp256k1_fe_mul(&psVar15->x,&r[(long)local_68].x,psVar12);
          local_68 = unaff_RBP;
        }
      }
      else {
        piStack_70 = (int *)0x158b74;
        secp256k1_ge_set_infinity(psVar15);
      }
      unaff_RBP = (int *)((long)unaff_RBP + 1);
      psVar15 = psVar15 + 1;
      psVar12 = (secp256k1_fe *)(psVar12[3].n + 1);
    } while ((int *)len != unaff_RBP);
  }
  piVar16 = local_68;
  if (local_68 == (int *)0xffffffffffffffff) {
    return;
  }
  psVar15 = (secp256k1_ge *)((long)local_68 * 0x68);
  a_00 = (secp256k1_gej *)(r + (long)local_68);
  b = (secp256k1_gej *)&stack0xffffffffffffffa0;
  piStack_70 = (int *)0x158bf5;
  secp256k1_fe_inv_var((secp256k1_fe *)b,(secp256k1_fe *)a_00);
  if (piVar16 != (int *)0x0) {
    unaff_RBP = (int *)((long)piVar16 + -1);
    psVar15 = r + -1 + (long)piVar16;
    piVar16 = &a[(long)((long)piVar16 + -1)].infinity;
    do {
      if (*piVar16 == 0) {
        piStack_70 = (int *)0x158c30;
        secp256k1_fe_mul(&r[(long)local_68].x,&psVar15->x,(secp256k1_fe *)&stack0xffffffffffffffa0);
        a_00 = (secp256k1_gej *)&stack0xffffffffffffffa0;
        piStack_70 = (int *)0x158c4d;
        b = a_00;
        secp256k1_fe_mul((secp256k1_fe *)a_00,(secp256k1_fe *)a_00,&a[(long)local_68].z);
        local_68 = unaff_RBP;
      }
      piVar16 = piVar16 + -0x26;
      psVar15 = psVar15 + -1;
      bVar17 = unaff_RBP != (int *)0x0;
      unaff_RBP = (int *)((long)unaff_RBP + -1);
    } while (bVar17);
  }
  if (a[(long)local_68].infinity == 0) {
    puVar1 = r[(long)local_68].x.n + 4;
    *puVar1 = local_40;
    puVar1[1] = uStack_38;
    puVar1 = r[(long)local_68].x.n + 2;
    *puVar1 = local_50;
    puVar1[1] = uStack_48;
    r[(long)local_68].x.n[0] = local_60;
    r[(long)local_68].x.n[1] = uStack_58;
    if (len == 0) {
      return;
    }
    do {
      if (a->infinity == 0) {
        piStack_70 = (int *)0x158cb9;
        secp256k1_ge_set_gej_zinv(r,a,&r->x);
      }
      piStack_70 = (int *)0x158cc1;
      secp256k1_ge_verify(r);
      r = r + 1;
      a = a + 1;
      len = len - 1;
    } while (len != 0);
    return;
  }
  piStack_70 = (int *)test_gej_cmov;
  secp256k1_ge_set_all_gej_var_cold_1();
  __src_00 = &sStack_130;
  psVar11 = &sStack_130;
  psStack_138 = (secp256k1_fe *)0x158d0f;
  sStack_98 = len;
  psStack_90 = psVar15;
  piStack_88 = piVar16;
  psStack_80 = a;
  psStack_78 = r;
  piStack_70 = unaff_RBP;
  memcpy(&sStack_130,b,0x98);
  psStack_138 = (secp256k1_fe *)0x158d17;
  secp256k1_gej_verify(&sStack_130);
  psStack_138 = (secp256k1_fe *)0x158d1f;
  secp256k1_gej_verify(a_00);
  psStack_138 = (secp256k1_fe *)0x158d2c;
  secp256k1_fe_cmov(&sStack_130.x,&a_00->x,0);
  psVar12 = &a_00->y;
  psStack_138 = (secp256k1_fe *)0x158d3f;
  secp256k1_fe_cmov(&sStack_130.y,psVar12,0);
  psVar14 = &sStack_130.z;
  psVar13 = &a_00->z;
  psStack_138 = (secp256k1_fe *)0x158d55;
  secp256k1_fe_cmov(psVar14,psVar13,0);
  psStack_138 = (secp256k1_fe *)0x158d5d;
  secp256k1_gej_verify(&sStack_130);
  psStack_138 = (secp256k1_fe *)0x158d68;
  __src = b;
  iVar9 = gej_xyz_equals_gej(&sStack_130,b);
  if (iVar9 == 0) {
    psStack_138 = (secp256k1_fe *)0x158dff;
    test_gej_cmov_cold_2();
  }
  else {
    psStack_138 = (secp256k1_fe *)0x158d7b;
    secp256k1_gej_verify(&sStack_130);
    psStack_138 = (secp256k1_fe *)0x158d83;
    secp256k1_gej_verify(a_00);
    psStack_138 = (secp256k1_fe *)0x158d93;
    secp256k1_fe_cmov(&sStack_130.x,&a_00->x,1);
    psStack_138 = (secp256k1_fe *)0x158da5;
    secp256k1_fe_cmov(&sStack_130.y,psVar12,1);
    psStack_138 = (secp256k1_fe *)0x158db5;
    secp256k1_fe_cmov(psVar14,psVar13,1);
    sStack_130.infinity = sStack_130.infinity & 0xfffffffeU | a_00->infinity & 1U;
    psStack_138 = (secp256k1_fe *)0x158dd9;
    secp256k1_gej_verify(&sStack_130);
    psStack_138 = (secp256k1_fe *)0x158de4;
    __src = a_00;
    iVar9 = gej_xyz_equals_gej(&sStack_130,a_00);
    __src_00 = psVar11;
    if (iVar9 != 0) {
      return;
    }
  }
  psStack_138 = (secp256k1_fe *)gej_xyz_equals_gej;
  test_gej_cmov_cold_1();
  psStack_138 = psVar13;
  psStack_140 = psVar12;
  puStack_148 = (undefined1 *)&sStack_130;
  psStack_150 = psVar14;
  psStack_158 = b;
  psStack_160 = a_00;
  if ((*(int *)((long)__src_00 + 0x90) != __src->infinity) || (*(int *)((long)__src_00 + 0x90) != 0)
     ) {
    return;
  }
  psStack_2a0 = (secp256k1_fe *)0x158e51;
  memcpy(&sStack_1f8,__src_00,0x98);
  psVar12 = &sStack_290;
  psStack_2a0 = (secp256k1_fe *)0x158e66;
  memcpy(psVar12,__src,0x98);
  psStack_2a0 = (secp256k1_fe *)0x158e6e;
  secp256k1_fe_normalize(&sStack_1f8);
  psStack_2a0 = (secp256k1_fe *)0x158e7e;
  secp256k1_fe_normalize(&sStack_1c8);
  psStack_2a0 = (secp256k1_fe *)0x158e8e;
  secp256k1_fe_normalize(&sStack_198);
  psStack_2a0 = (secp256k1_fe *)0x158e96;
  secp256k1_fe_normalize(psVar12);
  psVar13 = &sStack_260;
  psStack_2a0 = (secp256k1_fe *)0x158ea3;
  secp256k1_fe_normalize(psVar13);
  psVar14 = &sStack_230;
  psStack_2a0 = (secp256k1_fe *)0x158eb0;
  secp256k1_fe_normalize(psVar14);
  psStack_2a0 = (secp256k1_fe *)0x158eb8;
  secp256k1_fe_verify(&sStack_1f8);
  psStack_2a0 = (secp256k1_fe *)0x158ec0;
  secp256k1_fe_verify(psVar12);
  if (sStack_1f8.normalized == 0) {
    psStack_2a0 = (secp256k1_fe *)0x158fc5;
    gej_xyz_equals_gej_cold_6();
LAB_00158fc5:
    psVar13 = psVar12;
    psStack_2a0 = (secp256k1_fe *)0x158fca;
    gej_xyz_equals_gej_cold_5();
LAB_00158fca:
    psStack_2a0 = (secp256k1_fe *)0x158fcf;
    gej_xyz_equals_gej_cold_4();
LAB_00158fcf:
    psVar14 = psVar13;
    psStack_2a0 = (secp256k1_fe *)0x158fd4;
    gej_xyz_equals_gej_cold_3();
  }
  else {
    if (sStack_290.normalized == 0) goto LAB_00158fc5;
    uVar10 = 4;
    do {
      uVar2 = sStack_290.n[uVar10];
      uVar3 = sStack_1f8.n[uVar10];
      if ((uVar3 >= uVar2 && uVar3 != uVar2) || (uVar3 < uVar2)) break;
      bVar17 = uVar10 != 0;
      uVar10 = uVar10 - 1;
    } while (bVar17);
    psStack_2a0 = (secp256k1_fe *)0x158f0a;
    secp256k1_fe_verify(&sStack_1c8);
    psStack_2a0 = (secp256k1_fe *)0x158f12;
    secp256k1_fe_verify(psVar13);
    if (sStack_1c8.normalized == 0) goto LAB_00158fca;
    if (sStack_260.normalized == 0) goto LAB_00158fcf;
    uVar10 = 4;
    do {
      uVar2 = sStack_260.n[uVar10];
      uVar3 = sStack_1c8.n[uVar10];
      if ((uVar3 >= uVar2 && uVar3 != uVar2) || (uVar3 < uVar2)) break;
      bVar17 = uVar10 != 0;
      uVar10 = uVar10 - 1;
    } while (bVar17);
    psStack_2a0 = (secp256k1_fe *)0x158f63;
    secp256k1_fe_verify(&sStack_198);
    psStack_2a0 = (secp256k1_fe *)0x158f6b;
    secp256k1_fe_verify(psVar14);
    if (sStack_198.normalized != 0) {
      if (sStack_230.normalized != 0) {
        uVar10 = 4;
        do {
          if (sStack_198.n[uVar10] != sStack_230.n[uVar10]) {
            return;
          }
          bVar17 = uVar10 != 0;
          uVar10 = uVar10 - 1;
        } while (bVar17);
        return;
      }
      goto LAB_00158fd9;
    }
  }
  psStack_2a0 = (secp256k1_fe *)0x158fd9;
  gej_xyz_equals_gej_cold_2();
LAB_00158fd9:
  psStack_2a0 = (secp256k1_fe *)secp256k1_gej_has_quad_y_var;
  gej_xyz_equals_gej_cold_1();
  if ((int)psVar14[3].n[0] != 0) {
    return;
  }
  psStack_2a0 = &sStack_198;
  secp256k1_fe_mul(&sStack_2d0,psVar14 + 1,psVar14 + 2);
  secp256k1_fe_is_square_var(&sStack_2d0);
  return;
}

Assistant:

static void secp256k1_ge_set_all_gej_var(secp256k1_ge *r, const secp256k1_gej *a, size_t len) {
    secp256k1_fe u;
    size_t i;
    size_t last_i = SIZE_MAX;

    for (i = 0; i < len; i++) {
        secp256k1_gej_verify(&a[i]);
        if (a[i].infinity) {
            secp256k1_ge_set_infinity(&r[i]);
        } else {
            /* Use destination's x coordinates as scratch space */
            if (last_i == SIZE_MAX) {
                r[i].x = a[i].z;
            } else {
                secp256k1_fe_mul(&r[i].x, &r[last_i].x, &a[i].z);
            }
            last_i = i;
        }
    }
    if (last_i == SIZE_MAX) {
        return;
    }
    secp256k1_fe_inv_var(&u, &r[last_i].x);

    i = last_i;
    while (i > 0) {
        i--;
        if (!a[i].infinity) {
            secp256k1_fe_mul(&r[last_i].x, &r[i].x, &u);
            secp256k1_fe_mul(&u, &u, &a[last_i].z);
            last_i = i;
        }
    }
    VERIFY_CHECK(!a[last_i].infinity);
    r[last_i].x = u;

    for (i = 0; i < len; i++) {
        if (!a[i].infinity) {
            secp256k1_ge_set_gej_zinv(&r[i], &a[i], &r[i].x);
        }
        secp256k1_ge_verify(&r[i]);
    }
}